

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_residual.c
# Opt level: O2

int h264_residual_block(bitstream *str,h264_cabac_context *cabac,h264_slice *slice,
                       h264_macroblock *mb,int32_t *block,int *num,int cat,int idx,int start,int end
                       ,int maxnumcoeff,int coded)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (cabac == (h264_cabac_context *)0x0) {
    if (coded == 0) {
      uVar2 = 0;
      uVar3 = (ulong)(uint)maxnumcoeff;
      if (maxnumcoeff < 1) {
        uVar3 = uVar2;
      }
      for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
        if (str->dir == VS_ENCODE) {
          if (block[uVar2] != 0) {
            fwrite("Non-zero coordinate in a skipped block!\n",0x28,1,_stderr);
            return 1;
          }
        }
        else {
          block[uVar2] = 0;
        }
      }
      iVar1 = 0;
      if (num != (int *)0x0) {
        *num = 0;
      }
    }
    else {
      iVar1 = h264_residual_cavlc(str,slice,block,num,cat,idx,start,end,maxnumcoeff);
    }
  }
  else {
    iVar1 = h264_residual_cabac(str,cabac,slice,mb,block,cat,idx,start,end,maxnumcoeff,coded);
  }
  return iVar1;
}

Assistant:

int h264_residual_block(struct bitstream *str, struct h264_cabac_context *cabac, struct h264_slice *slice, struct h264_macroblock *mb, int32_t *block, int *num, int cat, int idx, int start, int end, int maxnumcoeff, int coded) {
	if (!cabac) {
		if (!coded) {
			int i;
			for (i = 0; i < maxnumcoeff; i++) {
				if (str->dir == VS_ENCODE) {
					if (block[i]) {
						fprintf(stderr, "Non-zero coordinate in a skipped block!\n");
						return 1;
					}
				} else {
					block[i] = 0;
				}
			}
			if (num)
				*num = 0;
			return 0;
		} else {
			return h264_residual_cavlc(str, slice, block, num, cat, idx, start, end, maxnumcoeff);
		}
	} else {
		return h264_residual_cabac(str, cabac, slice, mb, block, cat, idx, start, end, maxnumcoeff, coded);
	}
}